

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Snapshot::getHeatFlux(Snapshot *this)

{
  Vector<double,_3U> *in_RSI;
  Vector<double,_3U> *in_RDI;
  Snapshot *in_stack_ffffffffffffff88;
  Vector<double,_3U> *v1;
  
  v1 = in_RDI;
  getConductiveHeatFlux(in_stack_ffffffffffffff88);
  getConvectiveHeatFlux(in_stack_ffffffffffffff88);
  OpenMD::operator+(v1,in_RSI);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_RSI,(Vector<double,_3U> *)in_stack_ffffffffffffff88);
  return (Vector3d *)in_RDI;
}

Assistant:

Vector3d Snapshot::getHeatFlux() {
    // BE CAREFUL WITH UNITS
    return getConductiveHeatFlux() + getConvectiveHeatFlux();
  }